

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O3

Ref<embree::XML> __thiscall
embree::parseXML(embree *this,FileName *fileName,string *id,bool hasHeader)

{
  pointer pcVar1;
  FileStream *this_00;
  Ref<embree::Stream<int>_> local_50;
  string local_48;
  
  this_00 = (FileStream *)operator_new(0x270);
  FileStream::FileStream(this_00,fileName);
  local_50.ptr = (Stream<int> *)this_00;
  (*(this_00->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_00);
  pcVar1 = (id->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + id->_M_string_length);
  parseXML(this,&local_50,&local_48,hasHeader,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((FileStream *)local_50.ptr != (FileStream *)0x0) {
    (*(((Stream<int> *)&(local_50.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  return (Ref<embree::XML>)(XML *)this;
}

Assistant:

Ref<XML> parseXML(const FileName& fileName, std::string id, bool hasHeader) {
    return parseXML(new FileStream(fileName),id,hasHeader,false);
  }